

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::QualifierOverrideLayoutTest::prepareVertexBuffer
          (QualifierOverrideLayoutTest *this,program *program,buffer *buffer,vertexArray *vao)

{
  GLint GVar1;
  int iVar2;
  deUint32 dVar3;
  GLchar *name;
  TestError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  GLchar *in_R8;
  Functions *gl;
  GLsizeiptr data_size;
  GLfloat data [4];
  undefined1 local_48 [4];
  GLint test_loc;
  string test_name;
  vertexArray *vao_local;
  buffer *buffer_local;
  program *program_local;
  QualifierOverrideLayoutTest *this_local;
  long lVar5;
  
  __len = 0x2b4a735;
  test_name.field_2._8_8_ = vao;
  Utils::getVariableName_abi_cxx11_
            ((string *)local_48,(Utils *)&DAT_00000001,COMPUTE_SHADER,0x2b4a735,in_R8);
  name = (GLchar *)std::__cxx11::string::c_str();
  GVar1 = Utils::program::getAttribLocation(program,name);
  iVar2 = (int)name;
  if (GVar1 != 2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Vertex attribute location is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x1eef);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  Utils::vertexArray::generate((vertexArray *)test_name.field_2._8_8_);
  Utils::vertexArray::bind((vertexArray *)test_name.field_2._8_8_,iVar2,__addr,__len);
  Utils::buffer::generate(buffer,0x8892);
  data_size = 0x3f80000000000000;
  data[0] = 0.0;
  data[1] = 1.0;
  Utils::buffer::update(buffer,0x10,&data_size,0x88e4);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x19f0))(2,4,0x1406,0,0,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"VertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x1f02);
  (**(code **)(lVar5 + 0x610))(2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"EnableVertexAttribArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x1f06);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void QualifierOverrideLayoutTest::prepareVertexBuffer(const Utils::program& program, Utils::buffer& buffer,
													  Utils::vertexArray& vao)
{
	static const GLint expected_location = 2;

	std::string test_name = Utils::getVariableName(Utils::VERTEX_SHADER, Utils::INPUT, "test");
	GLint		test_loc  = program.getAttribLocation(test_name.c_str());

	if (expected_location != test_loc)
	{
		TCU_FAIL("Vertex attribute location is invalid");
	}

	vao.generate();
	vao.bind();

	buffer.generate(GL_ARRAY_BUFFER);

	GLfloat	data[]	= { 0.0f, 1.0f, 0.0f, 1.0f };
	GLsizeiptr data_size = sizeof(data);

	buffer.update(data_size, data, GL_STATIC_DRAW);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up vao */
	gl.vertexAttribPointer(test_loc, 4 /* size */, GL_FLOAT /* type */, GL_FALSE /* normalized*/, 0 /* stride */,
						   0 /* offset */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");

	/* Enable attribute */
	gl.enableVertexAttribArray(test_loc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");
}